

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_dc_predictor_16x64_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  long lVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  lVar11 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  do {
    uVar2 = *(ulong *)(above + lVar11);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar2;
    auVar3._12_2_ = (short)(uVar2 >> 0x30);
    auVar5._8_2_ = (short)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._10_4_ = auVar3._10_4_;
    auVar9._6_8_ = 0;
    auVar9._0_6_ = auVar5._8_6_;
    auVar7._4_2_ = (short)(uVar2 >> 0x10);
    auVar7._0_4_ = (uint)uVar2;
    auVar7._6_8_ = SUB148(auVar9 << 0x40,6);
    iVar14 = iVar14 + ((uint)uVar2 & 0xffff);
    iVar15 = iVar15 + auVar7._4_4_;
    iVar16 = iVar16 + auVar5._8_4_;
    iVar17 = iVar17 + (auVar3._10_4_ >> 0x10);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  iVar14 = iVar17 + iVar15 + iVar16 + iVar14;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  lVar11 = 0;
  do {
    uVar2 = *(ulong *)(left + lVar11);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar6._8_2_ = (short)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._10_4_ = auVar4._10_4_;
    auVar10._6_8_ = 0;
    auVar10._0_6_ = auVar6._8_6_;
    auVar8._4_2_ = (short)(uVar2 >> 0x10);
    auVar8._0_4_ = (uint)uVar2;
    auVar8._6_8_ = SUB148(auVar10 << 0x40,6);
    iVar14 = iVar14 + ((uint)uVar2 & 0xffff);
    iVar15 = iVar15 + auVar8._4_4_;
    iVar16 = iVar16 + auVar6._8_4_;
    iVar17 = iVar17 + (auVar4._10_4_ >> 0x10);
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x40);
  auVar13 = ZEXT416((iVar17 + iVar15 + iVar16 + iVar14 + 0x28U >> 4) * 0x6667 >> 0x11);
  auVar13 = pshuflw(auVar13,auVar13,0);
  uVar12 = auVar13._0_4_;
  iVar14 = 0;
  do {
    lVar11 = 0;
    do {
      puVar1 = dst + lVar11;
      *(undefined4 *)puVar1 = uVar12;
      *(undefined4 *)(puVar1 + 2) = uVar12;
      *(undefined4 *)(puVar1 + 4) = uVar12;
      *(undefined4 *)(puVar1 + 6) = uVar12;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x10);
    iVar14 = iVar14 + 1;
    dst = dst + stride;
  } while (iVar14 != 0x40);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x64_c(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  highbd_dc_predictor_rect(dst, stride, 16, 64, above, left, bd, 4,
                           HIGHBD_DC_MULTIPLIER_1X4);
}